

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  char *pcVar1;
  size_t sVar2;
  string compressionNames;
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  undefined8 local_38;
  char local_30;
  undefined7 uStack_2f;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Usage: ",7);
  if (program_name == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar2 = strlen(program_name);
    std::__ostream_insert<char,std::char_traits<char>>(stream,program_name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream," [options] infile [infile2...] [-o outfile]",0x2b);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
  std::ostream::put((char)stream);
  std::ostream::flush();
  if (verbose) {
    local_38 = 0;
    local_30 = '\0';
    local_60[0] = local_50;
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"/","");
    Imf_3_4::getCompressionNamesString((string *)local_60,(string *)&local_40);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               "Read an OpenEXR image from infile, write an identical copy to outfile reporting time taken to read/write and file sizes.\n\nOptions:\n\n  -o file                     file to write to. If no file specified, uses a memory buffer\n                              note: file may be overwritten multiple times during tests\n  -p n                        part number to copy, or \"all\" for all parts\n                              default is \"all\" \n\n  -m                          set to multi-threaded (system selected thread count)\n  -t n                        Use a pool of n worker threads for processing files.\n                              Default is single threaded (no thread pool)\n\n  -l level                    set DWA or ZIP compression level\n\n  -z,--compression list       list of compression methods to test\n                              ("
               ,0x344);
    pcVar1 = local_40;
    if (local_40 == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    }
    else {
      sVar2 = strlen(local_40);
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               ",orig,all\n                              default orig: retains original method)\n  --convert                   shorthand options for writing a new file with no metrics:\n                              -p all --type orig --time none --type orig --no-size --passes 1\n                              change pixel type or compression by specifying --type or -z after --convert\n  --bench                     shorthand options for robust performance benchmarking:\n                              -p all --compression all --time write,reread --passes 10 --type half,float --no-size --csv\n\n  -16 rgba|all                [DEPRECATED] force 16 bit half float: either just RGBA, or all channels\n                              Use --type half or --type mixed instead\n --pixelmode list             list of pixel types to use (float,half,mixed,orig)\n                              mixed uses half for RGBA, float for others. Default is \'orig\'\n --time list                  comma separated list of operations to report timing for.\n                              operations can be any of read,write,reread (use --time none for no timing)\n --no-size                    don\'t output size data\n --json                       print output as JSON dictionary (Default mode)\n --csv                        print output in csv mode. If passes>1, show median timing\n                              default is JSON mode\n --passes num                 write and re-read file num times (default 1)\n\n  -h, --help                  print this message\n  -v                          output progress messages\n\n  --version                   print version information\n\n"
               ,0x652);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name
           << " [options] infile [infile2...] [-o outfile]" << endl;

    if (verbose)
    {
        std::string compressionNames;
        getCompressionNamesString ("/", compressionNames);
        stream
            << "Read an OpenEXR image from infile, write an identical copy to outfile"
               " reporting time taken to read/write and file sizes.\n"
               "\n"
               "Options:\n"
               "\n"
               "  -o file                     file to write to. If no file specified, uses a memory buffer\n"
               "                              note: file may be overwritten multiple times during tests\n"
               "  -p n                        part number to copy, or \"all\" for all parts\n"
               "                              default is \"all\" \n"
               "\n"
               "  -m                          set to multi-threaded (system selected thread count)\n"
               "  -t n                        Use a pool of n worker threads for processing files.\n"
               "                              Default is single threaded (no thread pool)\n"
               "\n"
               "  -l level                    set DWA or ZIP compression level\n"
               "\n"
               "  -z,--compression list       list of compression methods to test\n"
               "                              ("
            << compressionNames.c_str ()
            << ",orig,all\n"
               "                              default orig: retains original method)\n"

               "  --convert                   shorthand options for writing a new file with no metrics:\n"
               "                              -p all --type orig --time none --type orig --no-size --passes 1\n"
               "                              change pixel type or compression by specifying --type or -z after --convert\n"
               "  --bench                     shorthand options for robust performance benchmarking:\n"
               "                              -p all --compression all --time write,reread --passes 10 --type half,float --no-size --csv\n"
               "\n"
               "  -16 rgba|all                [DEPRECATED] force 16 bit half float: either just RGBA, or all channels\n"
               "                              Use --type half or --type mixed instead\n"
               " --pixelmode list             list of pixel types to use (float,half,mixed,orig)\n"
               "                              mixed uses half for RGBA, float for others. Default is 'orig'\n"
               " --time list                  comma separated list of operations to report timing for.\n"
               "                              operations can be any of read,write,reread (use --time none for no timing)\n"
               " --no-size                    don't output size data\n"
               " --json                       print output as JSON dictionary (Default mode)\n"
               " --csv                        print output in csv mode. If passes>1, show median timing\n"
               "                              default is JSON mode\n"
               " --passes num                 write and re-read file num times (default 1)\n"
               "\n"
               "  -h, --help                  print this message\n"
               "  -v                          output progress messages\n"
               "\n"
               "  --version                   print version information\n"
               "\n";
    }
}